

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

String * __thiscall
Diligent::GetTextureDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,TextureDesc *Desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  char *Delimiter;
  Uint32 CpuAccessFlags;
  String local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Type: ","");
  GetResourceDimString((RESOURCE_DIMENSION)this[8]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&local_48,*(uint *)(this + 0xc));
  uVar3 = std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_RAX;
  }
  uVar2 = (uint)CONCAT71((int7)((ulong)uVar3 >> 8),this[8]);
  Delimiter = (char *)(ulong)(uVar2 - 4);
  if ((byte)(uVar2 - 4) < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ToString<unsigned_int>(&local_48,*(uint *)(this + 0x10));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar2 = (uint)(byte)this[8];
    if (this[8] == (Diligent)0x6) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ToString<unsigned_int>(&local_48,*(uint *)(this + 0x14));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (uint)(byte)this[8];
    }
  }
  if (((byte)uVar2 < 9) && (Delimiter = (char *)0x1a8, (0x1a8U >> (uVar2 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ToString<unsigned_int>(&local_48,*(uint *)(this + 0x14));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(this + 0x18));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&local_48,*(uint *)(this + 0x1c));
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&local_48,*(uint *)(this + 0x20));
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetUsageString((USAGE)this[0x28]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetBindFlagsString_abi_cxx11_
            (&local_48,(Diligent *)(ulong)*(uint *)(this + 0x24),0x3598ab,Delimiter);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetCPUAccessFlagsString_abi_cxx11_(&local_48,(Diligent *)(ulong)(byte)this[0x29],CpuAccessFlags);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetTextureDescString(const TextureDesc& Desc)
{
    String Str = "Type: ";
    Str += GetResourceDimString(Desc.Type);
    Str += "; size: ";
    Str += ToString(Desc.Width);

    if (Desc.Is2D() || Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Height);
    }

    if (Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Depth);
    }

    if (Desc.IsArray())
    {
        Str += "; Num Slices: ";
        Str += ToString(Desc.ArraySize);
    }

    const char* FmtName = GetTextureFormatAttribs(Desc.Format).Name;
    Str += "; Format: ";
    Str += FmtName;

    Str += "; Mip levels: ";
    Str += ToString(Desc.MipLevels);

    Str += "; Sample Count: ";
    Str += ToString(Desc.SampleCount);

    Str += "; Usage: ";
    Str += GetUsageString(Desc.Usage);

    Str += "; Bind Flags: ";
    Str += GetBindFlagsString(Desc.BindFlags);

    Str += "; CPU access: ";
    Str += GetCPUAccessFlagsString(Desc.CPUAccessFlags);

    return Str;
}